

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O0

iterator __thiscall Track::find(Track *this,Header *header)

{
  iterator __first;
  iterator __last;
  __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> _Var1;
  Header *header_local;
  Track *this_local;
  
  __first = begin(this);
  __last = end(this);
  _Var1 = std::
          find_if<__gnu_cxx::__normal_iterator<Sector*,std::vector<Sector,std::allocator<Sector>>>,Track::find(Header_const&)::__0>
                    (__first._M_current,__last._M_current,
                     (anon_class_8_1_5858d3cb_for__M_pred)header);
  return (iterator)_Var1._M_current;
}

Assistant:

std::vector<Sector>::iterator Track::find(const Header& header)
{
    return std::find_if(begin(), end(), [&](const Sector& s) {
        return header == s.header;
        });
}